

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

void __thiscall
pybind11::detail::EigenConformable<false>::EigenConformable
          (EigenConformable<false> *this,EigenIndex r,EigenIndex c,EigenIndex rstride,
          EigenIndex cstride)

{
  Stride<_1,__1> local_40;
  long local_30;
  EigenIndex cstride_local;
  EigenIndex rstride_local;
  EigenIndex c_local;
  EigenIndex r_local;
  EigenConformable<false> *this_local;
  
  this->conformable = true;
  this->rows = r;
  this->cols = c;
  local_30 = cstride;
  cstride_local = rstride;
  rstride_local = c;
  c_local = r;
  r_local = (EigenIndex)this;
  Eigen::Stride<-1,_-1>::Stride(&this->stride,0,0);
  this->negativestrides = false;
  if ((cstride_local < 0) || (local_30 < 0)) {
    this->negativestrides = true;
  }
  else {
    Eigen::Stride<-1,_-1>::Stride(&local_40,local_30,cstride_local);
    (this->stride).m_outer.m_value = local_40.m_outer.m_value;
    (this->stride).m_inner.m_value = local_40.m_inner.m_value;
  }
  return;
}

Assistant:

EigenConformable(EigenIndex r, EigenIndex c,
            EigenIndex rstride, EigenIndex cstride) :
        conformable{true}, rows{r}, cols{c} {
        // TODO: when Eigen bug #747 is fixed, remove the tests for non-negativity. http://eigen.tuxfamily.org/bz/show_bug.cgi?id=747
        if (rstride < 0 || cstride < 0) {
            negativestrides = true;
        } else {
            stride = {EigenRowMajor ? rstride : cstride /* outer stride */,
                      EigenRowMajor ? cstride : rstride /* inner stride */ };
        }
    }